

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O0

void __thiscall PeleLM::post_regrid(PeleLM *this,int lbase,int new_finest)

{
  bool bVar1;
  int iVar2;
  int in_EDX;
  int in_ESI;
  NavierStokesBase *in_RDI;
  Array4<double> *rhoY;
  Array4<double> *rho;
  Box *bx;
  MFIter mfi;
  MultiFab *Snew;
  int in_stack_fffffffffffffdec;
  Amr *in_stack_fffffffffffffdf0;
  Amr *in_stack_fffffffffffffdf8;
  NavierStokesBase *in_stack_fffffffffffffe00;
  undefined1 local_1f0 [7];
  undefined1 in_stack_fffffffffffffe17;
  FabArrayBase *in_stack_fffffffffffffe18;
  MFIter *in_stack_fffffffffffffe20;
  anon_class_128_2_e6bb172a *in_stack_fffffffffffffe38;
  Box *in_stack_fffffffffffffe40;
  MFIter *in_stack_fffffffffffffe50;
  undefined1 local_170 [64];
  undefined1 local_130 [64];
  undefined1 *local_f0;
  undefined1 local_e8 [64];
  undefined1 *local_a8;
  undefined1 local_9c [132];
  NavierStokesBase *local_18;
  int local_c;
  
  local_c = in_ESI;
  NavierStokesBase::post_regrid(in_RDI,in_ESI,in_EDX);
  if (do_set_rho_to_species_sum != 0) {
    iVar2 = amrex::Amr::levelSteps(in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec);
    if ((0 < iVar2) && (local_c < (in_RDI->super_AmrLevel).level)) {
      in_stack_fffffffffffffe00 =
           (NavierStokesBase *)
           amrex::AmrLevel::get_new_data
                     ((AmrLevel *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec);
      local_18 = in_stack_fffffffffffffe00;
      amrex::TilingIfNotGPU();
      amrex::MFIter::MFIter
                (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,(bool)in_stack_fffffffffffffe17
                );
      while (bVar1 = amrex::MFIter::isValid((MFIter *)(local_9c + 0x24)), bVar1) {
        amrex::MFIter::tilebox(in_stack_fffffffffffffe50);
        local_9c._28_8_ = local_9c;
        iVar2 = (int)((ulong)in_stack_fffffffffffffdf0 >> 0x20);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)in_stack_fffffffffffffe00,
                   (MFIter *)in_stack_fffffffffffffdf8,iVar2);
        local_a8 = local_e8;
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)in_stack_fffffffffffffe00,
                   (MFIter *)in_stack_fffffffffffffdf8,iVar2);
        local_f0 = local_130;
        if (clipSpeciesOnRegrid != 0) {
          in_stack_fffffffffffffdf8 = (Amr *)local_9c._28_8_;
          memcpy(local_170,local_f0,0x3c);
          amrex::ParallelFor<PeleLM::post_regrid(int,int)::__0>
                    (in_stack_fffffffffffffe40,(anon_class_64_1_8991137e *)in_stack_fffffffffffffe38
                    );
        }
        in_stack_fffffffffffffdf0 = (Amr *)local_9c._28_8_;
        memcpy(local_1f0,local_a8,0x3c);
        memcpy(&stack0xfffffffffffffe50,local_f0,0x3c);
        amrex::ParallelFor<PeleLM::post_regrid(int,int)::__1>
                  (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
        amrex::MFIter::operator++((MFIter *)(local_9c + 0x24));
      }
      amrex::MFIter::~MFIter((MFIter *)in_stack_fffffffffffffdf0);
    }
    NavierStokesBase::make_rho_curr_time(in_stack_fffffffffffffe00);
  }
  return;
}

Assistant:

void
PeleLM::post_regrid (int lbase,
                     int new_finest)
{
   BL_PROFILE("PLM::post_regrid()");
   NavierStokesBase::post_regrid(lbase, new_finest);
   //
   // FIXME: This may be necessary regardless, unless the interpolation
   //        to fine from coarse data preserves rho=sum(rho.Y)
   //
   if (!do_set_rho_to_species_sum) return;

   if (parent->levelSteps(0)>0 && level>lbase) {
      MultiFab& Snew = get_new_data(State_Type);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
      for (MFIter mfi(Snew,TilingIfNotGPU()); mfi.isValid(); ++mfi)
      {
         const Box& bx = mfi.tilebox();
         auto const& rho     = Snew.array(mfi,Density);
         auto const& rhoY    = Snew.array(mfi,first_spec);
         if (clipSpeciesOnRegrid) {
            amrex::ParallelFor(bx, [rhoY]
            AMREX_GPU_DEVICE (int i, int j, int k) noexcept
            {
               fabMinMax( i, j, k, NUM_SPECIES, 0.0, Real_MAX, rhoY);
            });
         }
         amrex::ParallelFor(bx, [rho, rhoY]
         AMREX_GPU_DEVICE (int i, int j, int k) noexcept
         {
            rho(i,j,k) = 0.0;
            for (int n = 0; n < NUM_SPECIES; n++) {
               rho(i,j,k) += rhoY(i,j,k,n);
            }
         });
      }
   }
   make_rho_curr_time();
}